

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

void __thiscall QFbScreen::setDirty(QFbScreen *this,QRect *rect)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  auVar3 = QRect::operator&(rect,(QRect *)(this + 0x50));
  iVar1 = (int)*(ulong *)(this + 0x50);
  uVar2 = *(ulong *)(this + 0x50) & 0xffffffff00000000;
  local_20._0_8_ = (ulong)(uint)(auVar3._0_4_ - iVar1) | auVar3._0_8_ - uVar2 & 0xffffffff00000000;
  local_20._8_8_ = (ulong)(uint)(auVar3._8_4_ - iVar1) | auVar3._8_8_ - uVar2 & 0xffffffff00000000;
  QRegion::operator+=((QRegion *)(this + 0x38),&local_20);
  scheduleUpdate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::setDirty(const QRect &rect)
{
    const QRect intersection = rect.intersected(mGeometry);
    const QPoint screenOffset = mGeometry.topLeft();
    mRepaintRegion += intersection.translated(-screenOffset); // global to local translation
    scheduleUpdate();
}